

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

Data parseWatsonFromStream(FILE *fp)

{
  int iVar1;
  VM vm_00;
  Data pvVar2;
  Data d;
  int c;
  VM vm;
  FILE *fp_local;
  
  vm_00 = newFileVM(LexerA,fp);
  while( true ) {
    iVar1 = fgetc((FILE *)fp);
    if (iVar1 == -1) break;
    parseCommand(vm_00,(char)iVar1);
  }
  pvVar2 = pop(vm_00->stack);
  freeVM(vm_00);
  return pvVar2;
}

Assistant:

Data parseWatsonFromStream(FILE *fp) {
    VM vm = newFileVM(LexerA, fp);
    int c;
    while ((c = fgetc(fp)) != EOF)parseCommand(vm, (char) c);
    Data d = pop(vm->stack);
    freeVM(vm);
    return d;
}